

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O1

bool EndsWith(string *s,string *suffix)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  uVar1 = s->_M_string_length;
  uVar2 = suffix->_M_string_length;
  if (uVar2 <= uVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)s);
    if (local_38 == suffix->_M_string_length) {
      if (local_38 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_40,(suffix->_M_dataplus)._M_p,local_38);
        bVar4 = iVar3 == 0;
      }
      goto LAB_00105d53;
    }
  }
  bVar4 = false;
LAB_00105d53:
  if ((uVar2 <= uVar1) && (local_40 != local_30)) {
    operator_delete(local_40);
  }
  return bVar4;
}

Assistant:

static bool EndsWith(const string& s, const string& suffix) {
  return (s.length() >= suffix.length() &&
          s.substr(s.length() - suffix.length()) == suffix);
}